

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void removePaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  
  if (h != 0) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (olinebits != 0) {
        uVar5 = uVar4 + olinebits;
        sVar6 = olinebits;
        uVar7 = uVar3;
        do {
          bVar1 = '\x01' << (~(byte)uVar4 & 7);
          if ((in[uVar7 >> 3] >> (~(byte)uVar7 & 7) & 1) == 0) {
            out[uVar4 >> 3] = out[uVar4 >> 3] & ~bVar1;
          }
          else {
            out[uVar4 >> 3] = out[uVar4 >> 3] | bVar1;
          }
          uVar4 = uVar4 + 1;
          uVar7 = uVar7 + 1;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
        uVar3 = uVar3 + olinebits;
      }
      uVar3 = uVar3 + (ilinebits - olinebits);
      uVar2 = uVar2 + 1;
      uVar4 = uVar5;
    } while (uVar2 != h);
  }
  return;
}

Assistant:

static void removePaddingBits(unsigned char* out, const unsigned char* in,
                              size_t olinebits, size_t ilinebits, unsigned h)
{
  /*
  After filtering there are still padding bits if scanlines have non multiple of 8 bit amounts. They need
  to be removed (except at last scanline of (Adam7-reduced) image) before working with pure image buffers
  for the Adam7 code, the color convert code and the output to the user.
  in and out are allowed to be the same buffer, in may also be higher but still overlapping; in must
  have >= ilinebits*h bits, out must have >= olinebits*h bits, olinebits must be <= ilinebits
  also used to move bits after earlier such operations happened, e.g. in a sequence of reduced images from Adam7
  only useful if (ilinebits - olinebits) is a value in the range 1..7
  */
  unsigned y;
  size_t diff = ilinebits - olinebits;
  size_t ibp = 0, obp = 0; /*input and output bit pointers*/
  for(y = 0; y < h; y++)
  {
    size_t x;
    for(x = 0; x < olinebits; x++)
    {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    ibp += diff;
  }
}